

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> *
lf::io::ReadGmshFile
          (variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> *__return_storage_ptr__,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this;
  result_type rVar2;
  int iVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  const_iterator end;
  const_iterator iter;
  string local_608;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[12]>_>_>,_0L>
  that;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_1;
  string local_5c0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  header;
  string storage;
  uint *local_550;
  undefined8 local_548;
  uint local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_530;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  header_parser;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>
  that_3;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  version_parser;
  string error;
  vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  local_460;
  pointer local_448;
  pointer local_438;
  vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_> local_430;
  vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
  local_418 [13];
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[15]>_>_>,_0L>
  that_6;
  proto_child0 local_2c8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  *local_2c0;
  proto_child0 *local_2b8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>
  *local_2b0;
  proto_child0 **local_2a8;
  undefined1 *local_2a0;
  proto_child0 ***local_298;
  undefined1 *local_290;
  proto_child0 local_288;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  *local_280;
  proto_child0 *local_278;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<bool>_>_>,_0L>
  *local_270;
  proto_child0 **local_268;
  undefined1 *local_260;
  proto_child0 ***local_258;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<int>_>_>,_0L>
  *local_250;
  undefined1 *local_248;
  proto_child0 ****local_240;
  ifstream in;
  byte abStack_21f [7];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,(string *)filename,_S_in|_S_bin);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    error._M_dataplus._M_p = (pointer)&error.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&error,"Could not open file ","");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&error,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_550 = &local_540;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_550,error._M_dataplus._M_p,
               error._M_dataplus._M_p + error._M_string_length);
    *puVar4 = &PTR__LfException_00458dd8;
    puVar4[1] = puVar4 + 3;
    if (local_550 == &local_540) {
      *(uint *)(puVar4 + 3) = local_540;
      *(undefined4 *)((long)puVar4 + 0x1c) = uStack_53c;
      *(undefined4 *)(puVar4 + 4) = uStack_538;
      *(undefined4 *)((long)puVar4 + 0x24) = uStack_534;
    }
    else {
      puVar4[1] = local_550;
      puVar4[3] = CONCAT44(uStack_53c,local_540);
    }
    puVar4[2] = local_548;
    local_548 = 0;
    local_540 = local_540 & 0xffffff00;
    local_550 = &local_540;
    __cxa_throw(puVar4,&base::LfException::typeinfo,base::LfException::~LfException);
  }
  storage._M_dataplus._M_p = (pointer)&storage.field_2;
  storage._M_string_length = 0;
  abStack_21f[*(long *)(_in + -0x18)] = abStack_21f[*(long *)(_in + -0x18)] & 0xef;
  storage.field_2._M_local_buf[0] = '\0';
  local_530._M_ok = true;
  local_530._M_stream = (istream_type *)&in;
  std::istream_iterator<char,_char,_std::char_traits<char>,_long>::_M_read(&local_530);
  error._M_dataplus._M_p = (pointer)local_530._M_stream;
  error._M_string_length = CONCAT62(error._M_string_length._2_6_,local_530._8_2_);
  version_parser.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x0;
  version_parser.name_._M_dataplus._M_p = version_parser.name_._M_dataplus._M_p & 0xffffffffffff0000
  ;
  std::__copy_move<false,false,std::input_iterator_tag>::
  __copy_m<std::istream_iterator<char,char,std::char_traits<char>,long>,std::back_insert_iterator<std::__cxx11::string>>
            ((istream_iterator<char,_char,_std::char_traits<char>,_long> *)&error,
             (istream_iterator<char,_char,_std::char_traits<char>,_long> *)&version_parser,&storage)
  ;
  iter._M_current = storage._M_dataplus._M_p;
  end._M_current = storage._M_dataplus._M_p + storage._M_string_length;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       (pointer)&header.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl.field_2;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .super__Tuple_impl<1UL,_bool,_int,_int>.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
  super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
       (_Head_base<3UL,_int,_false>)0x0;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = 0;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = 0;
  header.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_local_buf[0] = '\0';
  paVar1 = &error.field_2;
  error._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&error,"unnamed-rule","");
  version_parser.name_._M_dataplus._M_p = (pointer)&version_parser.name_.field_2;
  version_parser.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )&version_parser;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&version_parser.name_,error._M_dataplus._M_p,
             error._M_dataplus._M_p + error._M_string_length);
  version_parser.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != paVar1) {
    operator_delete(error._M_dataplus._M_p,error.field_2._M_allocated_capacity + 1);
  }
  boost::
  function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
  ::operator=((function<bool(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,boost::spirit::context<boost::fusion::cons<std::__cxx11::string&,boost::fusion::nil_>,boost::fusion::vector<>>&,boost::spirit::unused_type_const&)>
               *)&version_parser.f,
              (parser_binder<boost::spirit::qi::plus<boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::ascii>_>,_boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::punct,_boost::spirit::char_encoding::ascii>_>,_boost::fusion::nil_>_>_>_>,_mpl_::bool_<true>_>
               *)&error);
  error._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&error,"unnamed-rule","");
  header_parser.
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&header_parser;
  header_parser.name_._M_dataplus._M_p = (pointer)&header_parser.name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&header_parser.name_,error._M_dataplus._M_p,
             error._M_dataplus._M_p + error._M_string_length);
  header_parser.f.
  super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != paVar1) {
    operator_delete(error._M_dataplus._M_p,error.field_2._M_allocated_capacity + 1);
  }
  local_608._M_dataplus._M_p = (pointer)&that;
  that.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>.
  super_store<0UL,_const_char_(&)[12]>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)
       anon_var_dwarf_4315d8;
  local_280 = &that_1;
  that_1.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_char>.
  super_store<0UL,_char>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_char>)(store<0UL,_char>)0x30;
  local_278 = &local_288;
  local_270 = &that_2;
  that_2.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_bool>.
  super_store<0UL,_bool>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_bool>)(store<0UL,_bool>)0x0;
  local_268 = &local_278;
  local_258 = &local_268;
  local_260 = &boost::spirit::int_;
  local_250 = &that_3;
  that_3.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>.
  super_store<0UL,_int>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_int>)(store<0UL,_int>)0x1;
  local_240 = &local_258;
  local_5c0._M_dataplus._M_p = (pointer)&local_248;
  local_248 = &boost::spirit::hold;
  local_2c0 = &that_4;
  that_4.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_char>.
  super_store<0UL,_char>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_char>)(store<0UL,_char>)0x31;
  local_2b8 = &local_2c8;
  local_2b0 = &that_5;
  that_5.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_bool>.
  super_store<0UL,_bool>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_bool>)(store<0UL,_bool>)0x1;
  local_2a8 = &local_2b8;
  local_298 = &local_2a8;
  local_2a0 = &boost::spirit::int_;
  local_5c0._M_string_length = (size_type)&local_298;
  local_290 = &boost::spirit::little_dword;
  local_608._M_string_length = (size_type)&local_5c0;
  error._M_dataplus._M_p = (pointer)&local_608;
  error._M_string_length = (size_type)&that_6;
  that_6.child0.args.
  super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[15]>.
  super_store<0UL,_const_char_(&)[15]>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[15]>)
       anon_var_dwarf_4315e4;
  local_2c8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&version_parser;
  local_288.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&version_parser;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::tuple<std::__cxx11::string,bool,int,int>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[12]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::hold>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::prot___irit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[15]>>>,0l>const&>,2l>>
            (&header_parser);
  local_608._M_dataplus._M_p = end._M_current;
  if (*(long *)((long)header_parser.
                      super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                      .proto_expr_.child0.ref.t_ + 0x28) != 0) {
    error._M_dataplus._M_p = (pointer)&header;
    rVar2 = boost::
            function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
            ::operator()((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                          *)((long)header_parser.
                                   super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                                   .proto_expr_.child0.ref.t_ + 0x28),&iter,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_608,
                         (context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>
                          *)&error,
                         (char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>
                          *)&that);
    if (rVar2) {
      this = &header.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ;
      while (((iter._M_current != local_608._M_dataplus._M_p && (-1 < (long)*iter._M_current)) &&
             ((boost::spirit::char_encoding::ascii_char_types[*iter._M_current] & 0x40) != 0))) {
        iter._M_current = iter._M_current + 1;
      }
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&this->_M_head_impl,"4.1");
      if (iVar3 == 0) {
        ReadGmshFileV4((GMshFileV4 *)&error,iter,end,&this->_M_head_impl,
                       header.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       .super__Tuple_impl<1UL,_bool,_int,_int>.super__Head_base<1UL,_bool,_false>.
                       _M_head_impl,
                       header.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                       super__Head_base<2UL,_int,_false>._M_head_impl,
                       (int)header.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                            .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                            .super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                            _M_head_impl.super__Head_base<3UL,_int,_false>,filename);
        GMshFileV4::GMshFileV4((GMshFileV4 *)__return_storage_ptr__,(GMshFileV4 *)&error);
        (__return_storage_ptr__->super__Variant_base<lf::io::GMshFileV2,_lf::io::GMshFileV4>).
        super__Move_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Copy_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Move_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Copy_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Variant_storage_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>._M_index = '\x01';
        GMshFileV4::~GMshFileV4((GMshFileV4 *)&error);
      }
      else {
        iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&this->_M_head_impl,"2.2");
        if (iVar3 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&error);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)error.field_2._M_local_buf,"GmshFiles with Version ",0x17);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)error.field_2._M_local_buf,
                              header.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                              ._M_head_impl._M_dataplus._M_p,
                              header.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                              ._M_head_impl._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," are not yet supported.",0x17);
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"false","");
          that.child0.args.
          super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>.
          super_store<0UL,_const_char_(&)[12]>.elem =
               (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)
               (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)
               &local_5d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&that,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed(&local_608,(string *)&that,0x2b8,&local_5c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
            operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
          }
          if (that.child0.args.
              super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>.
              super_store<0UL,_const_char_(&)[12]>.elem !=
              (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)&local_5d8
             ) {
            operator_delete((void *)that.child0.args.
                                    super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>
                                    .super_store<0UL,_const_char_(&)[12]>.elem,
                            local_5d8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
          }
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"this code should not be reached");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        readGmshFileV2((GMshFileV2 *)&error,iter,end,&this->_M_head_impl,
                       header.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       .super__Tuple_impl<1UL,_bool,_int,_int>.super__Head_base<1UL,_bool,_false>.
                       _M_head_impl,
                       header.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                       .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                       super__Head_base<2UL,_int,_false>._M_head_impl,
                       (int)header.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                            .super__Tuple_impl<1UL,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_int>
                            .super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                            _M_head_impl.super__Head_base<3UL,_int,_false>,filename);
        std::__detail::__variant::_Uninitialized<lf::io::GMshFileV2,_false>::
        _Uninitialized<lf::io::GMshFileV2>
                  ((_Uninitialized<lf::io::GMshFileV2,_false> *)__return_storage_ptr__,&error);
        (__return_storage_ptr__->super__Variant_base<lf::io::GMshFileV2,_lf::io::GMshFileV4>).
        super__Move_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Copy_assign_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Move_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Copy_ctor_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>.
        super__Variant_storage_alias<lf::io::GMshFileV2,_lf::io::GMshFileV4>._M_index = '\0';
        std::
        vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
        ::~vector(local_418);
        std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>::
        ~vector(&local_430);
        if (local_448 != (pointer)0x0) {
          operator_delete(local_448,(long)local_438 - (long)local_448);
        }
        std::
        vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
        ::~vector(&local_460);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error._M_dataplus._M_p != paVar1) {
          operator_delete(error._M_dataplus._M_p,error.field_2._M_allocated_capacity + 1);
        }
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
      ::~function_n(&header_parser.f.
                     super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                   );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header_parser.name_._M_dataplus._M_p != &header_parser.name_.field_2) {
        operator_delete(header_parser.name_._M_dataplus._M_p,
                        header_parser.name_.field_2._M_allocated_capacity + 1);
      }
      boost::
      function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
      ::~function_n(&version_parser.f.
                     super_function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::unused_type_&>
                   );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)version_parser.name_._M_dataplus._M_p != &version_parser.name_.field_2) {
        operator_delete(version_parser.name_._M_dataplus._M_p,
                        version_parser.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p !=
          &header.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl.field_2) {
        operator_delete(header.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p,
                        CONCAT71(header.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl.field_2._M_allocated_capacity._1_7_,
                                 header.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int,_int>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)storage._M_dataplus._M_p != &storage.field_2) {
        operator_delete(storage._M_dataplus._M_p,
                        CONCAT71(storage.field_2._M_allocated_capacity._1_7_,
                                 storage.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(&in);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&error);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)error.field_2._M_local_buf,"Could not read header of file ",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)error.field_2._M_local_buf,(filename->_M_dataplus)._M_p,
             filename->_M_string_length);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"succesful","");
  that.child0.args.super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>.
  super_store<0UL,_const_char_(&)[12]>.elem =
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)
       (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)&local_5d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&that,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_608,(string *)&that,0x2ad,&local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if (that.child0.args.
      super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>.
      super_store<0UL,_const_char_(&)[12]>.elem !=
      (vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>)&local_5d8) {
    operator_delete((void *)that.child0.args.
                            super_vector_data<std::integer_sequence<unsigned_long,_0UL>,_const_char_(&)[12]>
                            .super_store<0UL,_const_char_(&)[12]>.elem,
                    local_5d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"this code should not be reached");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::variant<GMshFileV2, GMshFileV4> ReadGmshFile(const std::string& filename) {
  // Open file and copy it into memory:
  /////////////////////////////////////////////////////////////////////////////
  std::ifstream in(filename, std::ios_base::in | std::ios_base::binary);
  if (!in) {
    std::string error("Could not open file ");
    error += filename;
    throw lf::base::LfException(error);
  }

  std::string storage;
  in.unsetf(std::ios::skipws);  // no white space skipping
  std::copy(std::istream_iterator<char>(in), std::istream_iterator<char>(),
            std::back_inserter(storage));

  // Parse header to determine if we are dealing with ASCII format or binary
  // format + little or big endian:
  /////////////////////////////////////////////////////////////////////////////
  auto iter = storage.cbegin();
  auto end = storage.cend();

  namespace qi = boost::spirit::qi;
  namespace ascii = boost::spirit::ascii;

  // version, is_binary, sizeof(size_t), 1 (as int)
  std::tuple<std::string, bool, int, int> header;
  qi::rule<decltype(iter), std::string()> version_parser;

  version_parser %= +(ascii::alnum | ascii::punct);
  qi::rule<decltype(iter), decltype(header)(), ascii::space_type> header_parser;
  header_parser %= qi::lit("$MeshFormat") >>
                   (qi::hold[(version_parser >> qi::lit('0') >>
                              qi::attr(false) >> qi::int_ >> qi::attr(1))] |
                    (version_parser >> qi::lit('1') >> qi::attr(true) >>
                     qi::int_ >> qi::little_dword)) >>
                   qi::lit("$EndMeshFormat");

  bool succesful;
  succesful = qi::phrase_parse(iter, end, header_parser, ascii::space, header);

  LF_VERIFY_MSG(succesful, "Could not read header of file " << filename);

  if (std::get<0>(header) == "4.1") {
    return ReadGmshFileV4(iter, end, std::get<0>(header), std::get<1>(header),
                          std::get<2>(header), std::get<3>(header), filename);
  }
  if (std::get<0>(header) == "2.2") {
    return readGmshFileV2(iter, end, std::get<0>(header), std::get<1>(header),
                          std::get<2>(header), std::get<3>(header), filename);
  }
  LF_VERIFY_MSG(false, "GmshFiles with Version " << std::get<0>(header)
                                                 << " are not yet supported.");
}